

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DISENCHANT(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  char cVar2;
  uint32_t uVar3;
  char *pcVar4;
  char local_78 [8];
  char o_name [80];
  object *obj;
  wchar_t count;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  obj._0_4_ = 0;
  for (obj._4_4_ = L'\0'; obj._4_4_ < (int)(uint)(player->body).count;
      obj._4_4_ = obj._4_4_ + L'\x01') {
    _Var1 = slot_type_is(player,obj._4_4_,L'\x03');
    if (((!_Var1) && (_Var1 = slot_type_is(player,obj._4_4_,L'\x04'), !_Var1)) &&
       (_Var1 = slot_type_is(player,obj._4_4_,L'\x05'), !_Var1)) {
      obj._0_4_ = (uint32_t)obj + 1;
    }
  }
  obj._4_4_ = (wchar_t)(player->body).count;
  do {
    do {
      obj._4_4_ = obj._4_4_ + L'\xffffffff';
      if (obj._4_4_ < L'\0') goto LAB_0014e2be;
      _Var1 = slot_type_is(player,obj._4_4_,L'\x03');
    } while (((_Var1) || (_Var1 = slot_type_is(player,obj._4_4_,L'\x04'), _Var1)) ||
            (_Var1 = slot_type_is(player,obj._4_4_,L'\x05'), _Var1));
    uVar3 = Rand_div((uint32_t)obj);
    obj._0_4_ = (uint32_t)obj - 1;
  } while (uVar3 != 0);
LAB_0014e2be:
  context->ident = true;
  o_name._72_8_ = slot_object(player,obj._4_4_);
  if (((object *)o_name._72_8_ != (object *)0x0) &&
     (((0 < ((object *)o_name._72_8_)->to_h || (0 < ((object *)o_name._72_8_)->to_d)) ||
      (0 < ((object *)o_name._72_8_)->to_a)))) {
    object_desc(local_78,0x50,(object *)o_name._72_8_,0,player);
    if ((*(long *)(o_name._72_8_ + 0x10) == 0) || (uVar3 = Rand_div(100), 0x3b < (int)uVar3)) {
      _Var1 = slot_type_is(player,obj._4_4_,L'\x01');
      if ((_Var1) || (_Var1 = slot_type_is(player,obj._4_4_,L'\x02'), _Var1)) {
        if (0 < *(short *)(o_name._72_8_ + 0x48)) {
          *(short *)(o_name._72_8_ + 0x48) = *(short *)(o_name._72_8_ + 0x48) + -1;
        }
        if ((5 < *(short *)(o_name._72_8_ + 0x48)) && (uVar3 = Rand_div(100), (int)uVar3 < 0x14)) {
          *(short *)(o_name._72_8_ + 0x48) = *(short *)(o_name._72_8_ + 0x48) + -1;
        }
        *(undefined2 *)(*(long *)(o_name._72_8_ + 0x28) + 0x48) =
             *(undefined2 *)(o_name._72_8_ + 0x48);
        if (0 < *(short *)(o_name._72_8_ + 0x4a)) {
          *(short *)(o_name._72_8_ + 0x4a) = *(short *)(o_name._72_8_ + 0x4a) + -1;
        }
        if ((5 < *(short *)(o_name._72_8_ + 0x4a)) && (uVar3 = Rand_div(100), (int)uVar3 < 0x14)) {
          *(short *)(o_name._72_8_ + 0x4a) = *(short *)(o_name._72_8_ + 0x4a) + -1;
        }
        *(undefined2 *)(*(long *)(o_name._72_8_ + 0x28) + 0x4a) =
             *(undefined2 *)(o_name._72_8_ + 0x4a);
      }
      else {
        if (0 < *(short *)(o_name._72_8_ + 0x46)) {
          *(short *)(o_name._72_8_ + 0x46) = *(short *)(o_name._72_8_ + 0x46) + -1;
        }
        if ((5 < *(short *)(o_name._72_8_ + 0x46)) && (uVar3 = Rand_div(100), (int)uVar3 < 0x14)) {
          *(short *)(o_name._72_8_ + 0x46) = *(short *)(o_name._72_8_ + 0x46) + -1;
        }
        *(undefined2 *)(*(long *)(o_name._72_8_ + 0x28) + 0x46) =
             *(undefined2 *)(o_name._72_8_ + 0x46);
      }
      cVar2 = gear_to_label(player,(object *)o_name._72_8_);
      pcVar4 = "was";
      if (*(char *)(o_name._72_8_ + 0x11a) != '\x01') {
        pcVar4 = "were";
      }
      msg("Your %s (%c) %s disenchanted!",local_78,(ulong)(uint)(int)cVar2,pcVar4);
      player->upkeep->update = player->upkeep->update | 1;
      player->upkeep->redraw = player->upkeep->redraw | 0x40000;
    }
    else {
      cVar2 = gear_to_label(player,(object *)o_name._72_8_);
      pcVar4 = "s";
      if (*(char *)(o_name._72_8_ + 0x11a) != '\x01') {
        pcVar4 = "";
      }
      msg("Your %s (%c) resist%s disenchantment!",local_78,(ulong)(uint)(int)cVar2,pcVar4);
    }
  }
  return true;
}

Assistant:

bool effect_handler_DISENCHANT(effect_handler_context_t *context)
{
	int i, count = 0;
	struct object *obj;
	char o_name[80];

	/* Count slots */
	for (i = 0; i < player->body.count; i++) {
		/* Ignore rings, amulets and lights */
		if (slot_type_is(player, i, EQUIP_RING)) continue;
		if (slot_type_is(player, i, EQUIP_AMULET)) continue;
		if (slot_type_is(player, i, EQUIP_LIGHT)) continue;

		/* Count disenchantable slots */
		count++;
	}

	/* Pick one at random */
	for (i = player->body.count - 1; i >= 0; i--) {
		/* Ignore rings, amulets and lights */
		if (slot_type_is(player, i, EQUIP_RING)) continue;
		if (slot_type_is(player, i, EQUIP_AMULET)) continue;
		if (slot_type_is(player, i, EQUIP_LIGHT)) continue;

		if (one_in_(count--)) break;
	}

	/* Notice */
	context->ident = true;

	/* Get the item */
	obj = slot_object(player, i);

	/* No item, nothing happens */
	if (!obj) return true;

	/* Nothing to disenchant */
	if ((obj->to_h <= 0) && (obj->to_d <= 0) && (obj->to_a <= 0))
		return true;

	/* Describe the object */
	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

	/* Artifacts have a 60% chance to resist */
	if (obj->artifact && (randint0(100) < 60)) {
		/* Message */
		msg("Your %s (%c) resist%s disenchantment!", o_name,
			gear_to_label(player, obj),
			((obj->number != 1) ? "" : "s"));

		return true;
	}

	/* Apply disenchantment, depending on which kind of equipment */
	if (slot_type_is(player, i, EQUIP_WEAPON)
			|| slot_type_is(player, i, EQUIP_BOW)) {
		/* Disenchant to-hit */
		if (obj->to_h > 0) obj->to_h--;
		if ((obj->to_h > 5) && (randint0(100) < 20)) obj->to_h--;
		obj->known->to_h = obj->to_h;

		/* Disenchant to-dam */
		if (obj->to_d > 0) obj->to_d--;
		if ((obj->to_d > 5) && (randint0(100) < 20)) obj->to_d--;
		obj->known->to_d = obj->to_d;
	} else {
		/* Disenchant to-ac */
		if (obj->to_a > 0) obj->to_a--;
		if ((obj->to_a > 5) && (randint0(100) < 20)) obj->to_a--;
		obj->known->to_a = obj->to_a;
	}

	/* Message */
	msg("Your %s (%c) %s disenchanted!", o_name,
		gear_to_label(player, obj),
		((obj->number != 1) ? "were" : "was"));

	/* Recalculate bonuses */
	player->upkeep->update |= (PU_BONUS);

	/* Window stuff */
	player->upkeep->redraw |= (PR_EQUIP);

	return true;
}